

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureShadowTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::TextureCubeShadowCase::init(TextureCubeShadowCase *this,EVP_PKEY_CTX *ctx)

{
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  *this_00;
  deUint32 dVar1;
  long lVar2;
  int extraout_EAX;
  int iVar3;
  TextureCube *pTVar4;
  RenderTarget *pRVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  int levelNdx;
  ulong uVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_120;
  Vec4 cScale;
  Vec4 cBias;
  RGBA local_e0;
  RGBA local_dc;
  Vec4 local_d8;
  Vec4 local_c8;
  Vector<float,_4> local_b8;
  Vector<float,_4> local_a8;
  TextureFormatInfo fmtInfo;
  TextureFormat texFmt;
  Vector<float,_4> local_50;
  tcu local_40 [16];
  
  uVar10 = this->m_size;
  if (uVar10 == 0) {
    uVar8 = 0x20;
  }
  else {
    uVar8 = 0x1f;
    if (uVar10 != 0) {
      for (; uVar10 >> uVar8 == 0; uVar8 = uVar8 - 1) {
      }
    }
    uVar8 = uVar8 ^ 0x1f;
  }
  texFmt = glu::mapGLInternalFormat(this->m_format);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  tcu::Vector<float,_4>::Vector(&cBias,&fmtInfo.valueMin);
  tcu::operator-((tcu *)&cScale,&fmtInfo.valueMax,&fmtInfo.valueMin);
  pTVar4 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (pTVar4,((this->super_TestCase).m_context)->m_renderCtx,this->m_format,this->m_size);
  this->m_gradientTex = pTVar4;
  pTVar4 = (TextureCube *)operator_new(0x180);
  glu::TextureCube::TextureCube
            (pTVar4,((this->super_TestCase).m_context)->m_renderCtx,this->m_format,this->m_size);
  this->m_gridTex = pTVar4;
  if (init()::gradients == '\0') {
    iVar3 = __cxa_guard_acquire(&init()::gradients);
    if (iVar3 != 0) {
      init::gradients[0][0].m_data[0] = _DAT_018011a0;
      init::gradients[0][0].m_data[1] = _UNK_018011a4;
      init::gradients[0][0].m_data[2] = _UNK_018011a8;
      init::gradients[0][0].m_data[3] = _UNK_018011ac;
      init::gradients[0][1].m_data[0] = _DAT_01801120;
      init::gradients[0][1].m_data[1] = _UNK_01801124;
      init::gradients[0][1].m_data[2] = _UNK_01801128;
      init::gradients[0][1].m_data[3] = _UNK_0180112c;
      init::gradients[1][0].m_data[0] = _DAT_018011b0;
      init::gradients[1][0].m_data[1] = _UNK_018011b4;
      init::gradients[1][0].m_data[2] = _UNK_018011b8;
      init::gradients[1][0].m_data[3] = _UNK_018011bc;
      init::gradients[1][1].m_data[0] = _DAT_01801120;
      init::gradients[1][1].m_data[1] = _UNK_01801124;
      init::gradients[1][1].m_data[2] = _UNK_01801128;
      init::gradients[1][1].m_data[3] = _UNK_0180112c;
      init::gradients[2][0].m_data[0] = _DAT_018011c0;
      init::gradients[2][0].m_data[1] = _UNK_018011c4;
      init::gradients[2][0].m_data[2] = _UNK_018011c8;
      init::gradients[2][0].m_data[3] = _UNK_018011cc;
      init::gradients[2][1].m_data[0] = _DAT_01801120;
      init::gradients[2][1].m_data[1] = _UNK_01801124;
      init::gradients[2][1].m_data[2] = _UNK_01801128;
      init::gradients[2][1].m_data[3] = _UNK_0180112c;
      init::gradients[3][0].m_data[0] = _DAT_018011d0;
      init::gradients[3][0].m_data[1] = _UNK_018011d4;
      init::gradients[3][0].m_data[2] = _UNK_018011d8;
      init::gradients[3][0].m_data[3] = _UNK_018011dc;
      init::gradients[3][1].m_data[0] = _DAT_01801120;
      init::gradients[3][1].m_data[1] = _UNK_01801124;
      init::gradients[3][1].m_data[2] = _UNK_01801128;
      init::gradients[3][1].m_data[3] = _UNK_0180112c;
      init::gradients[4][0].m_data[0] = _DAT_018011e0;
      init::gradients[4][0].m_data[1] = _UNK_018011e4;
      init::gradients[4][0].m_data[2] = _UNK_018011e8;
      init::gradients[4][0].m_data[3] = _UNK_018011ec;
      init::gradients[4][1].m_data[0] = _DAT_01675840;
      init::gradients[4][1].m_data[1] = _UNK_01675844;
      init::gradients[4][1].m_data[2] = _UNK_01675848;
      init::gradients[4][1].m_data[3] = _UNK_0167584c;
      init::gradients[5][0].m_data[0] = _DAT_018011f0;
      init::gradients[5][0].m_data[1] = _UNK_018011f4;
      init::gradients[5][0].m_data[2] = _UNK_018011f8;
      init::gradients[5][0].m_data[3] = _UNK_018011fc;
      init::gradients[5][1].m_data[0] = _DAT_01801120;
      init::gradients[5][1].m_data[1] = _UNK_01801124;
      init::gradients[5][1].m_data[2] = _UNK_01801128;
      init::gradients[5][1].m_data[3] = _UNK_0180112c;
      __cxa_guard_release(&init()::gradients);
    }
  }
  for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
    lVar7 = 0;
    for (uVar9 = 0; 0x20 - uVar8 != uVar9; uVar9 = uVar9 + 1) {
      tcu::TextureCube::allocLevel(&this->m_gradientTex->m_refTexture,(CubeFace)lVar6,(int)uVar9);
      lVar2 = (long)(this->m_gradientTex->m_refTexture).m_access[lVar6].
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      tcu::operator*((tcu *)&local_a8,init::gradients[lVar6],&cScale);
      tcu::operator+((tcu *)&local_c8,&local_a8,&cBias);
      tcu::operator*((tcu *)&local_b8,init::gradients[lVar6] + 1,&cScale);
      tcu::operator+((tcu *)&local_d8,&local_b8,&cBias);
      tcu::fillWithComponentGradients((PixelBufferAccess *)(lVar2 + lVar7),&local_c8,&local_d8);
      lVar7 = lVar7 + 0x28;
    }
  }
  for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
    lVar7 = 0;
    for (uVar9 = 0; 0x20 - uVar8 != uVar9; uVar9 = uVar9 + 1) {
      tcu::TextureCube::allocLevel(&this->m_gridTex->m_refTexture,(CubeFace)lVar6,(int)uVar9);
      uVar10 = (int)(0xffffff / (ulong)((0x1f - uVar8) * 6 + 6)) * (int)uVar9 * (CubeFace)lVar6;
      local_dc.m_value = uVar10 | 0xff000000;
      lVar2 = (long)(this->m_gridTex->m_refTexture).m_access[lVar6].
                    super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      tcu::RGBA::toVec(&local_dc);
      tcu::operator*((tcu *)&local_a8,&local_d8,&cScale);
      tcu::operator+((tcu *)&local_c8,&local_a8,&cBias);
      local_e0.m_value = ~uVar10 | 0xff000000;
      tcu::RGBA::toVec(&local_e0);
      tcu::operator*(local_40,&local_50,&cScale);
      tcu::operator+((tcu *)&local_b8,(Vector<float,_4> *)local_40,&cBias);
      tcu::fillWithGrid((PixelBufferAccess *)(lVar2 + lVar7),4,&local_c8,(Vec4 *)&local_b8);
      lVar7 = lVar7 + 0x28;
    }
  }
  glu::TextureCube::upload(this->m_gradientTex);
  glu::TextureCube::upload(this->m_gridTex);
  dVar1 = this->m_compareFunc;
  if (dVar1 == 0x205 || dVar1 == 0x202) {
    fVar13 = 1.0;
  }
  else {
    fVar13 = 0.5;
  }
  local_120 = 0.0;
  if (dVar1 != 0x205 && dVar1 != 0x202) {
    local_120 = 0.5;
  }
  pRVar5 = Context::getRenderTarget((this->super_TestCase).m_context);
  iVar3 = pRVar5->m_numSamples;
  this_00 = &this->m_cases;
  if (iVar3 == 0) {
    pTVar4 = this->m_gradientTex;
    cBias.m_data[0] = -1.25;
    cBias.m_data[1] = -1.2;
    fVar11 = 1.2;
    fVar12 = 1.25;
  }
  else {
    pTVar4 = this->m_gradientTex;
    cBias.m_data[0] = -1.19;
    cBias.m_data[1] = -1.3;
    fVar11 = 1.1;
    fVar12 = 1.35;
  }
  cScale.m_data[1] = fVar12;
  cScale.m_data[0] = fVar11;
  FilterCase::FilterCase((FilterCase *)&fmtInfo,pTVar4,fVar13,(Vec2 *)&cBias,(Vec2 *)&cScale);
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)&fmtInfo);
  cBias.m_data[0] = 0.8;
  cBias.m_data[1] = 0.8;
  cScale.m_data[0] = 1.25;
  cScale.m_data[1] = 1.2;
  FilterCase::FilterCase
            ((FilterCase *)&fmtInfo,this->m_gradientTex,local_120,(Vec2 *)&cBias,(Vec2 *)&cScale);
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)&fmtInfo);
  cBias.m_data[0] = -1.19;
  cBias.m_data[1] = -1.3;
  cScale.m_data[0] = 1.1;
  cScale.m_data[1] = 1.35;
  FilterCase::FilterCase
            ((FilterCase *)&fmtInfo,this->m_gridTex,fVar13,(Vec2 *)&cBias,(Vec2 *)&cScale);
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)&fmtInfo);
  cBias.m_data[0] = -1.2;
  cBias.m_data[1] = -1.1;
  cScale.m_data[0] = -0.8;
  cScale.m_data[1] = -0.8;
  FilterCase::FilterCase
            ((FilterCase *)&fmtInfo,this->m_gridTex,local_120,(Vec2 *)&cBias,(Vec2 *)&cScale);
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)&fmtInfo);
  cBias.m_data[0] = -0.61;
  cBias.m_data[1] = -0.1;
  cScale.m_data[0] = 0.9;
  cScale.m_data[1] = 1.18;
  FilterCase::FilterCase((FilterCase *)&fmtInfo,this->m_gridTex,1.1,(Vec2 *)&cBias,(Vec2 *)&cScale);
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)&fmtInfo);
  if (iVar3 == 0) {
    pTVar4 = this->m_gridTex;
    fVar13 = 0.05;
  }
  else {
    pTVar4 = this->m_gridTex;
    fVar13 = 0.25;
  }
  cBias.m_data[0] = -0.75;
  cBias.m_data[1] = 1.0;
  cScale.m_data[1] = 0.75;
  cScale.m_data[0] = fVar13;
  FilterCase::FilterCase((FilterCase *)&fmtInfo,pTVar4,-0.1,(Vec2 *)&cBias,(Vec2 *)&cScale);
  std::
  vector<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase,_std::allocator<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>_>
  ::emplace_back<deqp::gles3::Functional::TextureCubeShadowCase::FilterCase>
            (this_00,(FilterCase *)&fmtInfo);
  this->m_caseNdx = 0;
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return extraout_EAX;
}

Assistant:

void TextureCubeShadowCase::init (void)
{
	try
	{
		DE_ASSERT(!m_gradientTex && !m_gridTex);

		int						numLevels	= deLog2Floor32(m_size)+1;
		tcu::TextureFormat		texFmt		= glu::mapGLInternalFormat(m_format);
		tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(texFmt);
		tcu::Vec4				cBias		= fmtInfo.valueMin;
		tcu::Vec4				cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

		// Create textures.
		m_gradientTex	= new glu::TextureCube(m_context.getRenderContext(), m_format, m_size);
		m_gridTex		= new glu::TextureCube(m_context.getRenderContext(), m_format, m_size);

		// Fill first with gradient texture.
		static const tcu::Vec4 gradients[tcu::CUBEFACE_LAST][2] =
		{
			{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative x
			{ tcu::Vec4( 0.0f, -1.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive x
			{ tcu::Vec4(-1.0f,  0.0f, -1.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // negative y
			{ tcu::Vec4(-1.0f, -1.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }, // positive y
			{ tcu::Vec4(-1.0f, -1.0f, -1.0f, 0.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f) }, // negative z
			{ tcu::Vec4( 0.0f,  0.0f,  0.0f, 2.0f), tcu::Vec4(1.0f, 1.0f, 1.0f, 0.0f) }  // positive z
		};
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				m_gradientTex->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithComponentGradients(m_gradientTex->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), gradients[face][0]*cScale + cBias, gradients[face][1]*cScale + cBias);
			}
		}

		// Fill second with grid texture.
		for (int face = 0; face < tcu::CUBEFACE_LAST; face++)
		{
			for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
			{
				deUint32	step	= 0x00ffffff / (numLevels*tcu::CUBEFACE_LAST);
				deUint32	rgb		= step*levelNdx*face;
				deUint32	colorA	= 0xff000000 | rgb;
				deUint32	colorB	= 0xff000000 | ~rgb;

				m_gridTex->getRefTexture().allocLevel((tcu::CubeFace)face, levelNdx);
				tcu::fillWithGrid(m_gridTex->getRefTexture().getLevelFace(levelNdx, (tcu::CubeFace)face), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
			}
		}

		// Upload.
		m_gradientTex->upload();
		m_gridTex->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		TextureCubeShadowCase::deinit();
		throw;
	}

	// Compute cases
	{
		const float refInRangeUpper		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 1.0f : 0.5f;
		const float refInRangeLower		= (m_compareFunc == GL_EQUAL || m_compareFunc == GL_NOTEQUAL) ? 0.0f : 0.5f;
		const float refOutOfBoundsUpper	= 1.1f;
		const float refOutOfBoundsLower	= -0.1f;
		const bool	singleSample		= m_context.getRenderTarget().getNumSamples() == 0;

		if (singleSample)
			m_cases.push_back(FilterCase(m_gradientTex,	refInRangeUpper, tcu::Vec2(-1.25f, -1.2f), tcu::Vec2(1.2f, 1.25f)));	// minification
		else
			m_cases.push_back(FilterCase(m_gradientTex,	refInRangeUpper, tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f)));	// minification - w/ tuned coordinates to avoid hitting triangle edges

		m_cases.push_back(FilterCase(m_gradientTex,	refInRangeLower,		tcu::Vec2(0.8f, 0.8f), tcu::Vec2(1.25f, 1.20f)));	// magnification
		m_cases.push_back(FilterCase(m_gridTex,		refInRangeUpper,		tcu::Vec2(-1.19f, -1.3f), tcu::Vec2(1.1f, 1.35f)));	// minification
		m_cases.push_back(FilterCase(m_gridTex,		refInRangeLower,		tcu::Vec2(-1.2f, -1.1f), tcu::Vec2(-0.8f, -0.8f)));	// magnification
		m_cases.push_back(FilterCase(m_gridTex,		refOutOfBoundsUpper,	tcu::Vec2(-0.61f, -0.1f), tcu::Vec2(0.9f, 1.18f)));	// reference value clamp, upper

		if (singleSample)
			m_cases.push_back(FilterCase(m_gridTex,	refOutOfBoundsLower, tcu::Vec2(-0.75f, 1.0f), tcu::Vec2(0.05f, 0.75f)));	// reference value clamp, lower
		else
			m_cases.push_back(FilterCase(m_gridTex,	refOutOfBoundsLower, tcu::Vec2(-0.75f, 1.0f), tcu::Vec2(0.25f, 0.75f)));	// reference value clamp, lower
	}

	m_caseNdx = 0;
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
}